

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void gc(Vm *vm)

{
  CallFrame *pCVar1;
  CrispyValue *pCVar2;
  Object *object;
  size_t sVar3;
  int k;
  long lVar4;
  int j;
  ulong uVar5;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 *paVar6;
  uint32_t uVar7;
  Object **ppOVar8;
  
  uVar7 = vm->frame_count;
  while( true ) {
    uVar7 = uVar7 - 1;
    if ((int)uVar7 < 0) break;
    pCVar1 = (vm->frames).frame_pointers[uVar7 & 0x7fffffff];
    lVar4 = 8;
    for (uVar5 = 0; uVar5 < (pCVar1->variables).count; uVar5 = uVar5 + 1) {
      pCVar2 = (pCVar1->variables).values;
      if (*(int *)((long)pCVar2 + lVar4 + -8) == 2) {
        mark(*(Object **)((long)&pCVar2->type + lVar4));
      }
      lVar4 = lVar4 + 0x10;
    }
    lVar4 = 8;
    for (uVar5 = 0; uVar5 < (pCVar1->constants).count; uVar5 = uVar5 + 1) {
      pCVar2 = (pCVar1->constants).values;
      if (*(int *)((long)pCVar2 + lVar4 + -8) == 2) {
        mark(*(Object **)((long)&pCVar2->type + lVar4));
      }
      lVar4 = lVar4 + 0x10;
    }
    paVar6 = &vm->stack[0].field_1;
    for (lVar4 = 0; lVar4 < (long)vm->sp - (long)vm >> 4; lVar4 = lVar4 + 1) {
      if (((CrispyValue *)(paVar6 + -1))->type == OBJECT) {
        mark(paVar6->o_value);
      }
      paVar6 = paVar6 + 2;
    }
  }
  ppOVar8 = &vm->first_object;
  while (object = *ppOVar8, object != (Object *)0x0) {
    if (object->marked == '\0') {
      *ppOVar8 = object->next;
      sVar3 = free_object(object);
      vm->allocated_mem = vm->allocated_mem - sVar3;
    }
    else {
      object->marked = '\0';
      ppOVar8 = &object->next;
    }
  }
  vm->max_alloc_mem = vm->allocated_mem * 2;
  return;
}

Assistant:

void gc(Vm *vm) {
#if DEBUG_TRACE_GC
    size_t mem_before = vm->allocated_mem;
#endif

#if DISABLE_GC
    return;
#endif

    mark_all(vm);
    sweep(vm);

    vm->max_alloc_mem = vm->allocated_mem * 2;

#if DEBUG_TRACE_GC
    printf("Collected %ld bytes, %ld remaining.\n", mem_before - vm->allocated_mem, vm->allocated_mem);
#endif
}